

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall cmCTest::RunCMakeAndTest(cmCTest *this,string *output)

{
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var1;
  char *pcVar2;
  int iVar3;
  char *__s;
  long *plVar4;
  ostringstream cmCTestLog_msg;
  long *local_1c0;
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  _Var1._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  (_Var1._M_head_impl)->Verbose = true;
  iVar3 = (**(code **)(*(long *)&((_Var1._M_head_impl)->BuildAndTestHandler).
                                 super_cmCTestGenericHandler + 8))
                    (&(_Var1._M_head_impl)->BuildAndTestHandler);
  __s = cmCTestBuildAndTestHandler::GetOutput(&(_Var1._M_head_impl)->BuildAndTestHandler);
  pcVar2 = (char *)output->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)output,0,pcVar2,(ulong)__s);
  cmDynamicLoader::FlushCache();
  if (iVar3 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"build and test failing returning: ",0x22);
    plVar4 = (long *)std::ostream::operator<<(local_1a0,iVar3);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0xb79,(char *)local_1c0,false);
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0,local_1b0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  return iVar3;
}

Assistant:

int cmCTest::RunCMakeAndTest(std::string* output)
{
  this->Impl->Verbose = true;
  cmCTestBuildAndTestHandler* handler = this->GetBuildAndTestHandler();
  int retv = handler->ProcessHandler();
  *output = handler->GetOutput();
#ifndef CMAKE_BOOTSTRAP
  cmDynamicLoader::FlushCache();
#endif
  if (retv != 0) {
    cmCTestLog(this, DEBUG,
               "build and test failing returning: " << retv << std::endl);
  }
  return retv;
}